

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDiscreteDynamicsWorld.cpp
# Opt level: O1

void __thiscall
btDiscreteDynamicsWorld::integrateTransforms(btDiscreteDynamicsWorld *this,btScalar timeStep)

{
  btTransform *convexFromWorld;
  undefined8 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  btBroadphaseProxy *pbVar4;
  btPersistentManifold *pbVar5;
  bool bVar6;
  ConvexResultCallback CVar7;
  int iVar8;
  undefined4 extraout_var;
  btRigidBody *this_00;
  btRigidBody *pbVar9;
  btScalar *pbVar10;
  long lVar11;
  long lVar12;
  float fVar13;
  btScalar bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  btVector3 imp;
  btSphereShape tmpSphere;
  btTransform modifiedPredictedTrans;
  btTransform predictedTrans;
  ConvexResultCallback local_188;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_138;
  btRigidBody *local_130;
  btScalar local_128;
  undefined8 local_120;
  btDispatcher *local_118;
  btVector3 local_110;
  undefined1 local_100 [2] [16];
  btScalar local_d4;
  btScalar local_c4;
  btTransform local_b8;
  btTransform local_70;
  
  CProfileManager::Start_Profile("integrateTransforms");
  if (0 < (this->m_nonStaticRigidBodies).m_size) {
    lVar12 = 0;
    do {
      pbVar9 = (this->m_nonStaticRigidBodies).m_data[lVar12];
      (pbVar9->super_btCollisionObject).m_hitFraction = 1.0;
      iVar8 = (pbVar9->super_btCollisionObject).m_activationState1;
      if (((iVar8 != 2) && (iVar8 != 5)) &&
         (((pbVar9->super_btCollisionObject).m_collisionFlags & 3) == 0)) {
        btRigidBody::predictIntegratedTransform(pbVar9,timeStep,&local_70);
        if ((this->super_btDynamicsWorld).super_btCollisionWorld.m_dispatchInfo.m_useContinuous ==
            true) {
          fVar13 = (pbVar9->super_btCollisionObject).m_ccdMotionThreshold;
          fVar13 = fVar13 * fVar13;
          if (((fVar13 != 0.0) || (NAN(fVar13))) &&
             (fVar15 = local_70.m_origin.m_floats[2] -
                       (pbVar9->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2],
             fVar16 = local_70.m_origin.m_floats[0] -
                      (pbVar9->super_btCollisionObject).m_worldTransform.m_origin.m_floats[0],
             fVar17 = local_70.m_origin.m_floats[1] -
                      (pbVar9->super_btCollisionObject).m_worldTransform.m_origin.m_floats[1],
             fVar13 < fVar15 * fVar15 + fVar16 * fVar16 + fVar17 * fVar17)) {
            CProfileManager::Start_Profile("CCD motion clamping");
            if (((pbVar9->super_btCollisionObject).m_collisionShape)->m_shapeType < 0x14) {
              gNumClampedCcdMotions = gNumClampedCcdMotions + 1;
              iVar8 = (*((this->super_btDynamicsWorld).super_btCollisionWorld.m_broadphasePairCache)
                        ->_vptr_btBroadphaseInterface[9])();
              local_120 = CONCAT44(extraout_var,iVar8);
              local_118 = (this->super_btDynamicsWorld).super_btCollisionWorld.m_dispatcher1;
              local_178 = *(undefined8 *)
                           (pbVar9->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
              uStack_170 = *(undefined8 *)
                            ((pbVar9->super_btCollisionObject).m_worldTransform.m_origin.m_floats +
                            2);
              local_138 = 0;
              local_188.m_closestHitFraction = 1.0;
              local_188.m_collisionFilterGroup = 1;
              local_188.m_collisionFilterMask = -1;
              local_188._vptr_ConvexResultCallback =
                   (_func_int **)&PTR__ConvexResultCallback_00228a20;
              local_128 = 0.0;
              bVar14 = (pbVar9->super_btCollisionObject).m_ccdSweptSphereRadius;
              local_130 = pbVar9;
              btConvexInternalShape::btConvexInternalShape((btConvexInternalShape *)local_100);
              CVar7 = local_188;
              convexFromWorld = &(pbVar9->super_btCollisionObject).m_worldTransform;
              local_100[0]._8_4_ = 8;
              local_100[0]._0_8_ = &PTR__btConvexShape_00226830;
              local_128 = (this->super_btDynamicsWorld).super_btCollisionWorld.m_dispatchInfo.
                          m_allowedCcdPenetration;
              pbVar4 = (pbVar9->super_btCollisionObject).m_broadphaseHandle;
              uVar2 = pbVar4->m_collisionFilterGroup;
              uVar3 = pbVar4->m_collisionFilterMask;
              local_188.m_collisionFilterMask = uVar3;
              local_188.m_collisionFilterGroup = uVar2;
              local_188._0_12_ = CVar7._0_12_;
              local_b8.m_basis.m_el[0].m_floats = *&(convexFromWorld->m_basis).m_el[0].m_floats;
              local_b8.m_basis.m_el[1].m_floats._0_8_ =
                   *(undefined8 *)
                    (pbVar9->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats;
              local_b8.m_basis.m_el[1].m_floats._8_8_ =
                   *(undefined8 *)
                    ((pbVar9->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats + 2
                    );
              local_b8.m_basis.m_el[2].m_floats._0_8_ =
                   *(undefined8 *)
                    (pbVar9->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats;
              local_b8.m_basis.m_el[2].m_floats._8_8_ =
                   *(undefined8 *)
                    ((pbVar9->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats + 2
                    );
              local_d4 = bVar14;
              local_c4 = bVar14;
              btCollisionWorld::convexSweepTest
                        ((btCollisionWorld *)this,(btConvexShape *)local_100,convexFromWorld,
                         &local_b8,&local_188,0.0);
              bVar14 = local_188.m_closestHitFraction;
              bVar6 = local_188.m_closestHitFraction < 1.0;
              if (bVar6) {
                (pbVar9->super_btCollisionObject).m_hitFraction = local_188.m_closestHitFraction;
                btRigidBody::predictIntegratedTransform
                          (pbVar9,local_188.m_closestHitFraction * timeStep,&local_70);
                (pbVar9->super_btCollisionObject).m_hitFraction = 0.0;
                btRigidBody::proceedToTransform(pbVar9,&local_70);
              }
              btConvexShape::~btConvexShape((btConvexShape *)local_100);
              if (1.0 <= bVar14) goto LAB_001adb54;
            }
            else {
LAB_001adb54:
              bVar6 = false;
            }
            CProfileManager::Stop_Profile();
            if (bVar6) goto LAB_001adb6a;
          }
        }
        btRigidBody::proceedToTransform(pbVar9,&local_70);
      }
LAB_001adb6a:
      lVar12 = lVar12 + 1;
    } while (lVar12 < (this->m_nonStaticRigidBodies).m_size);
  }
  if (this->m_applySpeculativeContactRestitution != false) {
    CProfileManager::Start_Profile("apply speculative contact restitution");
    if (0 < (this->m_predictiveManifolds).m_size) {
      lVar12 = 0;
      do {
        pbVar5 = (this->m_predictiveManifolds).m_data[lVar12];
        pbVar9 = (btRigidBody *)pbVar5->m_body0;
        this_00 = (btRigidBody *)pbVar5->m_body1;
        if (((pbVar9->super_btCollisionObject).m_internalType & 2) == 0) {
          pbVar9 = (btRigidBody *)0x0;
        }
        if (((this_00->super_btCollisionObject).m_internalType & 2) == 0) {
          this_00 = (btRigidBody *)0x0;
        }
        if (0 < pbVar5->m_cachedPoints) {
          pbVar10 = &pbVar5->m_pointCache[0].m_appliedImpulse;
          lVar11 = 0;
          do {
            bVar14 = btManifoldResult::calculateCombinedRestitution
                               (&pbVar9->super_btCollisionObject,&this_00->super_btCollisionObject);
            if ((0.0 < bVar14) && ((*pbVar10 != 0.0 || (NAN(*pbVar10))))) {
              fVar13 = *pbVar10;
              local_188._vptr_ConvexResultCallback._4_4_ =
                   bVar14 * fVar13 * -(float)((ulong)*(undefined8 *)
                                                      ((btVector3 *)(pbVar10 + -0xf))->m_floats >>
                                             0x20);
              local_188._vptr_ConvexResultCallback._0_4_ =
                   bVar14 * fVar13 * -(float)*(undefined8 *)
                                              ((btVector3 *)(pbVar10 + -0xf))->m_floats;
              local_188.m_closestHitFraction = -pbVar10[-0xd] * fVar13 * bVar14;
              local_188.m_collisionFilterGroup = 0;
              local_188.m_collisionFilterMask = 0;
              uVar1 = *(undefined8 *)
                       (pbVar9->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
              local_100[0]._4_4_ =
                   (float)((ulong)*(undefined8 *)((btVector3 *)(pbVar10 + -0x13))->m_floats >> 0x20)
                   - (float)((ulong)uVar1 >> 0x20);
              local_100[0]._0_4_ =
                   (float)*(undefined8 *)((btVector3 *)(pbVar10 + -0x13))->m_floats - (float)uVar1;
              local_100[0]._8_4_ =
                   pbVar10[-0x11] -
                   (pbVar9->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
              local_100[0]._12_4_ = 0.0;
              uVar1 = *(undefined8 *)
                       (this_00->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
              local_b8.m_basis.m_el[0].m_floats[1] =
                   (float)((ulong)*(undefined8 *)((btVector3 *)(pbVar10 + -0x17))->m_floats >> 0x20)
                   - (float)((ulong)uVar1 >> 0x20);
              local_b8.m_basis.m_el[0].m_floats[0] =
                   (float)*(undefined8 *)((btVector3 *)(pbVar10 + -0x17))->m_floats - (float)uVar1;
              local_b8.m_basis.m_el[0].m_floats[2] =
                   pbVar10[-0x15] -
                   (this_00->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
              local_b8.m_basis.m_el[0].m_floats[3] = 0.0;
              btRigidBody::applyImpulse(pbVar9,(btVector3 *)&local_188,(btVector3 *)local_100);
              local_110.m_floats[2] = -local_188.m_closestHitFraction;
              local_110.m_floats[0] =
                   (btScalar)(int)((ulong)local_188._vptr_ConvexResultCallback ^ 0x8000000080000000)
              ;
              local_110.m_floats[1] =
                   (btScalar)
                   (int)(((ulong)local_188._vptr_ConvexResultCallback ^ 0x8000000080000000) >> 0x20)
              ;
              local_110.m_floats[3] = 0.0;
              btRigidBody::applyImpulse(this_00,&local_110,(btVector3 *)&local_b8);
            }
            lVar11 = lVar11 + 1;
            pbVar10 = pbVar10 + 0x30;
          } while (lVar11 < pbVar5->m_cachedPoints);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < (this->m_predictiveManifolds).m_size);
    }
    CProfileManager::Stop_Profile();
  }
  CProfileManager::Stop_Profile();
  return;
}

Assistant:

void	btDiscreteDynamicsWorld::integrateTransforms(btScalar timeStep)
{
	BT_PROFILE("integrateTransforms");
	btTransform predictedTrans;
	for ( int i=0;i<m_nonStaticRigidBodies.size();i++)
	{
		btRigidBody* body = m_nonStaticRigidBodies[i];
		body->setHitFraction(1.f);

		if (body->isActive() && (!body->isStaticOrKinematicObject()))
		{

			body->predictIntegratedTransform(timeStep, predictedTrans);

			btScalar squareMotion = (predictedTrans.getOrigin()-body->getWorldTransform().getOrigin()).length2();



			if (getDispatchInfo().m_useContinuous && body->getCcdSquareMotionThreshold() && body->getCcdSquareMotionThreshold() < squareMotion)
			{
				BT_PROFILE("CCD motion clamping");
				if (body->getCollisionShape()->isConvex())
				{
					gNumClampedCcdMotions++;
#ifdef USE_STATIC_ONLY
					class StaticOnlyCallback : public btClosestNotMeConvexResultCallback
					{
					public:

						StaticOnlyCallback (btCollisionObject* me,const btVector3& fromA,const btVector3& toA,btOverlappingPairCache* pairCache,btDispatcher* dispatcher) :
						  btClosestNotMeConvexResultCallback(me,fromA,toA,pairCache,dispatcher)
						{
						}

					  	virtual bool needsCollision(btBroadphaseProxy* proxy0) const
						{
							btCollisionObject* otherObj = (btCollisionObject*) proxy0->m_clientObject;
							if (!otherObj->isStaticOrKinematicObject())
								return false;
							return btClosestNotMeConvexResultCallback::needsCollision(proxy0);
						}
					};

					StaticOnlyCallback sweepResults(body,body->getWorldTransform().getOrigin(),predictedTrans.getOrigin(),getBroadphase()->getOverlappingPairCache(),getDispatcher());
#else
					btClosestNotMeConvexResultCallback sweepResults(body,body->getWorldTransform().getOrigin(),predictedTrans.getOrigin(),getBroadphase()->getOverlappingPairCache(),getDispatcher());
#endif
					//btConvexShape* convexShape = static_cast<btConvexShape*>(body->getCollisionShape());
					btSphereShape tmpSphere(body->getCcdSweptSphereRadius());//btConvexShape* convexShape = static_cast<btConvexShape*>(body->getCollisionShape());
					sweepResults.m_allowedPenetration=getDispatchInfo().m_allowedCcdPenetration;

					sweepResults.m_collisionFilterGroup = body->getBroadphaseProxy()->m_collisionFilterGroup;
					sweepResults.m_collisionFilterMask  = body->getBroadphaseProxy()->m_collisionFilterMask;
					btTransform modifiedPredictedTrans = predictedTrans;
					modifiedPredictedTrans.setBasis(body->getWorldTransform().getBasis());

					convexSweepTest(&tmpSphere,body->getWorldTransform(),modifiedPredictedTrans,sweepResults);
					if (sweepResults.hasHit() && (sweepResults.m_closestHitFraction < 1.f))
					{

						//printf("clamped integration to hit fraction = %f\n",fraction);
						body->setHitFraction(sweepResults.m_closestHitFraction);
						body->predictIntegratedTransform(timeStep*body->getHitFraction(), predictedTrans);
						body->setHitFraction(0.f);
						body->proceedToTransform( predictedTrans);

#if 0
						btVector3 linVel = body->getLinearVelocity();

						btScalar maxSpeed = body->getCcdMotionThreshold()/getSolverInfo().m_timeStep;
						btScalar maxSpeedSqr = maxSpeed*maxSpeed;
						if (linVel.length2()>maxSpeedSqr)
						{
							linVel.normalize();
							linVel*= maxSpeed;
							body->setLinearVelocity(linVel);
							btScalar ms2 = body->getLinearVelocity().length2();
							body->predictIntegratedTransform(timeStep, predictedTrans);

							btScalar sm2 = (predictedTrans.getOrigin()-body->getWorldTransform().getOrigin()).length2();
							btScalar smt = body->getCcdSquareMotionThreshold();
							printf("sm2=%f\n",sm2);
						}
#else

						//don't apply the collision response right now, it will happen next frame
						//if you really need to, you can uncomment next 3 lines. Note that is uses zero restitution.
						//btScalar appliedImpulse = 0.f;
						//btScalar depth = 0.f;
						//appliedImpulse = resolveSingleCollision(body,(btCollisionObject*)sweepResults.m_hitCollisionObject,sweepResults.m_hitPointWorld,sweepResults.m_hitNormalWorld,getSolverInfo(), depth);


#endif

        				continue;
					}
				}
			}


			body->proceedToTransform( predictedTrans);

		}

	}

	///this should probably be switched on by default, but it is not well tested yet
	if (m_applySpeculativeContactRestitution)
	{
		BT_PROFILE("apply speculative contact restitution");
		for (int i=0;i<m_predictiveManifolds.size();i++)
		{
			btPersistentManifold* manifold = m_predictiveManifolds[i];
			btRigidBody* body0 = btRigidBody::upcast((btCollisionObject*)manifold->getBody0());
			btRigidBody* body1 = btRigidBody::upcast((btCollisionObject*)manifold->getBody1());

			for (int p=0;p<manifold->getNumContacts();p++)
			{
				const btManifoldPoint& pt = manifold->getContactPoint(p);
				btScalar combinedRestitution = btManifoldResult::calculateCombinedRestitution(body0, body1);

				if (combinedRestitution>0 && pt.m_appliedImpulse != 0.f)
				//if (pt.getDistance()>0 && combinedRestitution>0 && pt.m_appliedImpulse != 0.f)
				{
					btVector3 imp = -pt.m_normalWorldOnB * pt.m_appliedImpulse* combinedRestitution;

					const btVector3& pos1 = pt.getPositionWorldOnA();
					const btVector3& pos2 = pt.getPositionWorldOnB();

					btVector3 rel_pos0 = pos1 - body0->getWorldTransform().getOrigin();
					btVector3 rel_pos1 = pos2 - body1->getWorldTransform().getOrigin();

					if (body0)
						body0->applyImpulse(imp,rel_pos0);
					if (body1)
						body1->applyImpulse(-imp,rel_pos1);
				}
			}
		}
	}

}